

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON_bool cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *pcVar1;
  cJSON_bool cVar2;
  cJSON *pcVar3;
  
  cVar2 = 0;
  if (newitem != (cJSON *)0x0 && -1 < which) {
    pcVar3 = get_array_item(array,(ulong)(uint)which);
    if (pcVar3 == (cJSON *)0x0) {
      cVar2 = add_item_to_array(array,newitem);
      return cVar2;
    }
    pcVar1 = pcVar3->prev;
    if (pcVar3 == array->child) {
      newitem->next = pcVar3;
      newitem->prev = pcVar1;
      pcVar3->prev = newitem;
      array->child = newitem;
    }
    else {
      if (pcVar1 == (cJSON *)0x0) {
        return 0;
      }
      newitem->next = pcVar3;
      newitem->prev = pcVar1;
      pcVar3->prev = newitem;
      newitem->prev->next = newitem;
    }
    cVar2 = 1;
  }
  return cVar2;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0 || newitem == NULL)
    {
        return false;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        return add_item_to_array(array, newitem);
    }

    if (after_inserted != array->child && after_inserted->prev == NULL) {
        /* return false if after_inserted is a corrupted array item */
        return false;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
    return true;
}